

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::XGLImporter::InternReadFile
          (XGLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_type __new_size;
  aiScene *paVar1;
  aiNode *paVar2;
  aiLight *paVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  __uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
  this_00;
  MemoryIOStream *__p;
  IrrXMLReader *__p_00;
  undefined4 extraout_var_00;
  aiMesh **__s;
  aiMaterial **__s_00;
  aiLight **ppaVar7;
  DeadlyImportError *this_01;
  size_type sVar8;
  uint uVar9;
  ulong uVar10;
  allocator local_511;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  raw_reader;
  shared_ptr<Assimp::IOStream> stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  string local_4d8;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_4b8;
  CIrrXML_IOStreamReader st;
  TempScope scope;
  
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_scene = pScene;
  std::__cxx11::string::string((string *)&scope,"rb",(allocator *)&st);
  iVar5 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,scope.meshes._M_t._M_impl._0_8_);
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&stream,
             (IOStream *)CONCAT44(extraout_var,iVar5));
  std::__cxx11::string::~string((string *)&scope);
  if (stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    BaseImporter::GetExtension((string *)&scope,pFile);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &scope,"zgl");
    std::__cxx11::string::~string((string *)&scope);
    if (bVar4) {
      this_00.
      super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl =
           (__uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
            )operator_new(0x38);
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_4b8,&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>
                );
      StreamReader<false,_false>::StreamReader
                ((StreamReader<false,_false> *)
                 this_00.
                 super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                 .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl,
                 (shared_ptr<Assimp::IOStream> *)&local_4b8,false);
      raw_reader._M_t.
      super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
            )(__uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b8._M_refcount);
      inflateInit2_(&st,0xfffffffffffffff1,"1.2.11",0x70);
      StreamReader<false,_false>::IncPtr
                ((StreamReader<false,_false> *)
                 raw_reader._M_t.
                 super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                 .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl,2)
      ;
      st.super_IFileReadCallBack._vptr_IFileReadCallBack =
           *(_func_int ***)
            ((long)raw_reader._M_t.
                   super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                   .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl
            + 0x18);
      st.stream._0_4_ =
           *(int *)((long)raw_reader._M_t.
                          super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                          .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>.
                          _M_head_impl + 0x20) -
           (int)st.super_IFileReadCallBack._vptr_IFileReadCallBack;
      sVar8 = 0;
      do {
        st.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&scope;
        st.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0x400;
        uVar6 = inflate(&st,0);
        if (1 < uVar6) {
          std::__cxx11::string::string
                    ((string *)&local_4d8,
                     "Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file"
                     ,&local_511);
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
        }
        uVar9 = 0x400 - (int)st.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        __new_size = uVar9 + sVar8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&uncompressed,__new_size)
        ;
        memcpy(uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar8,&scope,(ulong)uVar9);
        sVar8 = __new_size;
      } while (uVar6 != 1);
      inflateEnd(&st);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_007f3ab0;
      __p->buffer = uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      __p->length = __new_size;
      __p->pos = 0;
      __p->own = false;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>,__p);
      std::
      unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      ::~unique_ptr(&raw_reader);
    }
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
              (&st,stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    __p_00 = irr::io::createIrrXMLReader(&st.super_IFileReadCallBack);
    std::__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>::
    reset<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>
              ((__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>
                *)&this->m_reader,__p_00);
    scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header;
    scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    scope.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scope.materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &scope.materials._M_t._M_impl.super__Rb_tree_header._M_header;
    scope.materials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    scope.materials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    scope.materials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scope.light = (aiLight *)0x0;
    scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         scope.meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    scope.materials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         scope.materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      bVar4 = ReadElement(this);
      if (!bVar4) break;
      iVar5 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[0xd])();
      iVar5 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar5),"world");
      if (iVar5 == 0) {
        ReadWorld(this,&scope);
      }
    }
    if ((scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_start) ||
       (scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string
                ((string *)&local_4d8,"failed to extract data from XGL file, no meshes loaded",
                 (allocator *)&raw_reader);
      LogFunctions<Assimp::XGLImporter>::ThrowException(&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
    }
    this->m_scene->mNumMeshes =
         (uint)((ulong)((long)scope.meshes_linear.
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)scope.meshes_linear.
                             super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
    paVar1 = this->m_scene;
    uVar10 = (ulong)paVar1->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar10);
    memset(__s,0,uVar10);
    paVar1->mMeshes = __s;
    if ((long)scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memmove(this->m_scene->mMeshes,
              scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    }
    this->m_scene->mNumMaterials =
         (uint)((ulong)((long)scope.materials_linear.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)scope.materials_linear.
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
    paVar1 = this->m_scene;
    uVar10 = (ulong)paVar1->mNumMaterials << 3;
    __s_00 = (aiMaterial **)operator_new__(uVar10);
    memset(__s_00,0,uVar10);
    paVar1->mMaterials = __s_00;
    if ((long)scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      memmove(this->m_scene->mMaterials,
              scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
              ._M_impl.super__Vector_impl_data._M_start,
              (long)scope.materials_linear.
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)scope.materials_linear.
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    if (scope.light != (aiLight *)0x0) {
      this->m_scene->mNumLights = 1;
      ppaVar7 = (aiLight **)operator_new__(8);
      paVar3 = scope.light;
      this->m_scene->mLights = ppaVar7;
      *this->m_scene->mLights = scope.light;
      paVar2 = this->m_scene->mRootNode;
      if ((aiNode *)scope.light != paVar2) {
        uVar6 = (paVar2->mName).length;
        ((scope.light)->mName).length = uVar6;
        memcpy(((scope.light)->mName).data,(paVar2->mName).data,(ulong)uVar6);
        (paVar3->mName).data[uVar6] = '\0';
      }
    }
    TempScope::dismiss(&scope);
    TempScope::~TempScope(&scope);
    CIrrXML_IOStreamReader::~CIrrXML_IOStreamReader(&st);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                 "Failed to open XGL/ZGL file ",pFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scope,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,"");
  DeadlyImportError::DeadlyImportError(this_01,(string *)&scope);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XGLImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_XGL
    std::vector<Bytef> uncompressed;
#endif

    m_scene = pScene;
    std::shared_ptr<IOStream> stream( pIOHandler->Open( pFile, "rb"));

    // check whether we can read from the file
    if( stream.get() == NULL) {
        throw DeadlyImportError( "Failed to open XGL/ZGL file " + pFile + "");
    }

    // see if its compressed, if so uncompress it
    if (GetExtension(pFile) == "zgl") {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_XGL
        ThrowException("Cannot read ZGL file since Assimp was built without compression support");
#else
        std::unique_ptr<StreamReaderLE> raw_reader(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // raw decompression without a zlib or gzip header
        inflateInit2(&zstream, -MAX_WBITS);

        // skip two extra bytes, zgl files do carry a crc16 upfront (I think)
        raw_reader->IncPtr(2);

        zstream.next_in   = reinterpret_cast<Bytef*>( raw_reader->GetPtr() );
        zstream.avail_in  = raw_reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
    #define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));
#endif
    }

    // construct the irrXML parser
    CIrrXML_IOStreamReader st(stream.get());
    m_reader.reset( createIrrXMLReader( ( IFileReadCallBack* ) &st ) );

    // parse the XML file
    TempScope scope;

    while (ReadElement())   {
        if (!ASSIMP_stricmp(m_reader->getNodeName(),"world")) {
            ReadWorld(scope);
        }
    }


    std::vector<aiMesh*>& meshes = scope.meshes_linear;
    std::vector<aiMaterial*>& materials = scope.materials_linear;
    if(!meshes.size() || !materials.size()) {
        ThrowException("failed to extract data from XGL file, no meshes loaded");
    }

    // copy meshes
    m_scene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    m_scene->mMeshes = new aiMesh*[m_scene->mNumMeshes]();
    std::copy(meshes.begin(),meshes.end(),m_scene->mMeshes);

    // copy materials
    m_scene->mNumMaterials = static_cast<unsigned int>(materials.size());
    m_scene->mMaterials = new aiMaterial*[m_scene->mNumMaterials]();
    std::copy(materials.begin(),materials.end(),m_scene->mMaterials);

    if (scope.light) {
        m_scene->mNumLights = 1;
        m_scene->mLights = new aiLight*[1];
        m_scene->mLights[0] = scope.light;

        scope.light->mName = m_scene->mRootNode->mName;
    }

    scope.dismiss();
}